

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O1

void av1_set_frame_refs(AV1_COMMON *cm,int *remapped_ref_idx,int lst_map_idx,int gld_map_idx)

{
  uint uVar1;
  SequenceHeader *pSVar2;
  RefCntBuffer *pRVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  undefined4 uVar10;
  int *piVar11;
  int map_idx;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  REF_FRAME_INFO ref_frame_info [8];
  undefined8 uStack_130;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 local_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  int aiStack_110 [2];
  ulong local_108;
  ulong local_100;
  int local_f8 [4];
  int local_e8 [38];
  int local_50;
  
  uVar1 = (cm->current_frame).order_hint;
  pSVar2 = cm->seq_params;
  iVar17 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f);
  uStack_118 = 0;
  uStack_114 = 0;
  aiStack_110[0] = 0;
  local_128 = 0;
  uStack_120 = 0;
  local_11c = 0;
  local_100 = (ulong)(uint)lst_map_idx;
  local_108 = (ulong)(uint)gld_map_idx;
  iVar6 = -1;
  piVar11 = local_e8;
  uVar12 = 0;
  iVar8 = -1;
  do {
    piVar11[-4] = (int)uVar12;
    *piVar11 = -1;
    pRVar3 = cm->ref_frame_map[uVar12];
    *(RefCntBuffer **)(piVar11 + -2) = pRVar3;
    if (pRVar3 != (RefCntBuffer *)0x0) {
      if (pRVar3->order_hint == 0xffffffff) {
        iVar7 = -1;
      }
      else {
        if ((pSVar2->order_hint_info).enable_order_hint == 0) {
          iVar7 = 0;
        }
        else {
          uVar13 = pRVar3->order_hint - uVar1;
          uVar14 = 1 << ((byte)(pSVar2->order_hint_info).order_hint_bits_minus_1 & 0x1f);
          iVar7 = (uVar14 - 1 & uVar13) - (uVar14 & uVar13);
        }
        iVar7 = iVar7 + iVar17;
      }
      if (local_100 == uVar12) {
        iVar6 = iVar7;
      }
      *piVar11 = iVar7;
      if (local_108 == uVar12) {
        iVar8 = iVar7;
      }
    }
    uVar12 = uVar12 + 1;
    piVar11 = piVar11 + 6;
  } while (uVar12 != 8);
  if ((iVar6 == -1) || (iVar17 <= iVar6)) {
    uStack_130 = 0x39d74a;
    aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if ((iVar8 == -1) || (iVar17 <= iVar8)) {
    uStack_130 = 0x39d76c;
    aom_internal_error(cm->error,AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }
  uStack_130 = 0x39d787;
  qsort(local_f8,8,0x18,compare_ref_frame_info);
  iVar6 = 0;
  iVar8 = -1;
  lVar9 = 0x10;
  do {
    if (*(int *)((long)local_f8 + lVar9) == -1) {
      iVar6 = iVar6 + 1;
    }
    else if (iVar17 <= *(int *)((long)local_f8 + lVar9)) goto LAB_0039d7b9;
    iVar8 = iVar8 + 1;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0xd0);
  iVar8 = 7;
LAB_0039d7b9:
  iVar17 = 7;
  if (iVar8 < 7) {
    remapped_ref_idx[6] = local_50;
    aiStack_110[0] = 1;
    iVar17 = 6;
  }
  iVar7 = iVar8 + 1;
  if (iVar8 < iVar17) {
    remapped_ref_idx[4] = local_f8[(long)iVar7 * 6];
    uStack_118 = 1;
    iVar7 = iVar8 + 2;
  }
  if (iVar7 <= iVar17) {
    remapped_ref_idx[5] = local_f8[(long)iVar7 * 6];
    _uStack_114 = CONCAT44(aiStack_110[0],1);
  }
  lVar9 = (long)iVar6;
  uVar10 = (undefined4)local_128;
  if (iVar6 <= iVar8) {
    piVar11 = local_f8 + lVar9 * 6;
    iVar17 = (iVar8 - iVar6) + 1;
    do {
      iVar7 = *piVar11;
      if (iVar7 == lst_map_idx) {
        *remapped_ref_idx = iVar7;
        uVar10 = 1;
      }
      if (iVar7 == gld_map_idx) {
        remapped_ref_idx[3] = iVar7;
        local_11c = 1;
      }
      piVar11 = piVar11 + 6;
      iVar17 = iVar17 + -1;
    } while (iVar17 != 0);
  }
  local_128 = CONCAT44(local_128._4_4_,uVar10);
  uVar12 = 0;
  do {
    lVar15 = (long)"\x02\x03\x05\x06\a"[uVar12];
    if (*(int *)((long)&uStack_130 + lVar15 * 4 + 4) == 1) {
LAB_0039d87b:
      bVar5 = false;
    }
    else {
      bVar5 = true;
      bVar4 = iVar8 < iVar6;
      if (iVar6 <= iVar8) {
        lVar16 = (long)iVar8;
        if (local_f8[lVar16 * 6] == (int)local_100 || local_f8[lVar16 * 6] == (int)local_108) {
          piVar11 = aiStack_110 + lVar16 * 6;
          do {
            iVar8 = iVar8 + -1;
            bVar4 = lVar16 <= lVar9;
            if (lVar16 <= lVar9) goto LAB_0039d8ea;
            iVar17 = *piVar11;
            piVar11 = piVar11 + -6;
            lVar16 = lVar16 + -1;
          } while (iVar17 == lst_map_idx || iVar17 == gld_map_idx);
        }
        iVar8 = (int)lVar16;
        if (!bVar4) {
          remapped_ref_idx[lVar15 + -1] = local_f8[(long)iVar8 * 6];
          *(undefined4 *)((long)&uStack_130 + lVar15 * 4 + 4) = 1;
          iVar8 = iVar8 + -1;
          goto LAB_0039d87b;
        }
      }
    }
LAB_0039d8ea:
    if (bVar5) goto LAB_0039d925;
    uVar12 = uVar12 + 1;
  } while (uVar12 != 5);
  uVar12 = 5;
LAB_0039d925:
  if ((uint)uVar12 < 5) {
    uVar12 = uVar12 & 0xffffffff;
    do {
      lVar15 = (long)"\x02\x03\x05\x06\a"[uVar12];
      if (*(int *)((long)&uStack_130 + lVar15 * 4 + 4) != 1) {
        remapped_ref_idx[lVar15 + -1] = local_f8[lVar9 * 6];
        *(undefined4 *)((long)&uStack_130 + lVar15 * 4 + 4) = 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != 5);
  }
  return;
}

Assistant:

void av1_set_frame_refs(AV1_COMMON *const cm, int *remapped_ref_idx,
                        int lst_map_idx, int gld_map_idx) {
  int lst_frame_sort_idx = -1;
  int gld_frame_sort_idx = -1;

  assert(cm->seq_params->order_hint_info.enable_order_hint);
  assert(cm->seq_params->order_hint_info.order_hint_bits_minus_1 >= 0);
  const int cur_order_hint = (int)cm->current_frame.order_hint;
  const int cur_frame_sort_idx =
      1 << cm->seq_params->order_hint_info.order_hint_bits_minus_1;

  REF_FRAME_INFO ref_frame_info[REF_FRAMES];
  int ref_flag_list[INTER_REFS_PER_FRAME] = { 0, 0, 0, 0, 0, 0, 0 };

  for (int i = 0; i < REF_FRAMES; ++i) {
    const int map_idx = i;

    ref_frame_info[i].map_idx = map_idx;
    ref_frame_info[i].sort_idx = -1;

    RefCntBuffer *const buf = cm->ref_frame_map[map_idx];
    ref_frame_info[i].buf = buf;

    if (buf == NULL) continue;
    // If this assertion fails, there is a reference leak.
    assert(buf->ref_count > 0);

    const int offset = (int)buf->order_hint;
    ref_frame_info[i].sort_idx =
        (offset == -1) ? -1
                       : cur_frame_sort_idx +
                             get_relative_dist(&cm->seq_params->order_hint_info,
                                               offset, cur_order_hint);
    assert(ref_frame_info[i].sort_idx >= -1);

    if (map_idx == lst_map_idx) lst_frame_sort_idx = ref_frame_info[i].sort_idx;
    if (map_idx == gld_map_idx) gld_frame_sort_idx = ref_frame_info[i].sort_idx;
  }

  // Confirm both LAST_FRAME and GOLDEN_FRAME are valid forward reference
  // frames.
  if (lst_frame_sort_idx == -1 || lst_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as LAST");
  }
  if (gld_frame_sort_idx == -1 || gld_frame_sort_idx >= cur_frame_sort_idx) {
    aom_internal_error(cm->error, AOM_CODEC_CORRUPT_FRAME,
                       "Inter frame requests a look-ahead frame as GOLDEN");
  }

  // Sort ref frames based on their frame_offset values.
  qsort(ref_frame_info, REF_FRAMES, sizeof(REF_FRAME_INFO),
        compare_ref_frame_info);

  // Identify forward and backward reference frames.
  // Forward  reference: offset < order_hint
  // Backward reference: offset >= order_hint
  int fwd_start_idx = 0, fwd_end_idx = REF_FRAMES - 1;

  for (int i = 0; i < REF_FRAMES; i++) {
    if (ref_frame_info[i].sort_idx == -1) {
      fwd_start_idx++;
      continue;
    }

    if (ref_frame_info[i].sort_idx >= cur_frame_sort_idx) {
      fwd_end_idx = i - 1;
      break;
    }
  }

  int bwd_start_idx = fwd_end_idx + 1;
  int bwd_end_idx = REF_FRAMES - 1;

  // === Backward Reference Frames ===

  // == ALTREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_end_idx]);
    ref_flag_list[ALTREF_FRAME - LAST_FRAME] = 1;
    bwd_end_idx--;
  }

  // == BWDREF_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, BWDREF_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[BWDREF_FRAME - LAST_FRAME] = 1;
    bwd_start_idx++;
  }

  // == ALTREF2_FRAME ==
  if (bwd_start_idx <= bwd_end_idx) {
    set_ref_frame_info(remapped_ref_idx, ALTREF2_FRAME - LAST_FRAME,
                       &ref_frame_info[bwd_start_idx]);
    ref_flag_list[ALTREF2_FRAME - LAST_FRAME] = 1;
  }

  // === Forward Reference Frames ===

  for (int i = fwd_start_idx; i <= fwd_end_idx; ++i) {
    // == LAST_FRAME ==
    if (ref_frame_info[i].map_idx == lst_map_idx) {
      set_ref_frame_info(remapped_ref_idx, LAST_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[LAST_FRAME - LAST_FRAME] = 1;
    }

    // == GOLDEN_FRAME ==
    if (ref_frame_info[i].map_idx == gld_map_idx) {
      set_ref_frame_info(remapped_ref_idx, GOLDEN_FRAME - LAST_FRAME,
                         &ref_frame_info[i]);
      ref_flag_list[GOLDEN_FRAME - LAST_FRAME] = 1;
    }
  }

  assert(ref_flag_list[LAST_FRAME - LAST_FRAME] == 1 &&
         ref_flag_list[GOLDEN_FRAME - LAST_FRAME] == 1);

  // == LAST2_FRAME ==
  // == LAST3_FRAME ==
  // == BWDREF_FRAME ==
  // == ALTREF2_FRAME ==
  // == ALTREF_FRAME ==

  // Set up the reference frames in the anti-chronological order.
  static const MV_REFERENCE_FRAME ref_frame_list[INTER_REFS_PER_FRAME - 2] = {
    LAST2_FRAME, LAST3_FRAME, BWDREF_FRAME, ALTREF2_FRAME, ALTREF_FRAME
  };

  int ref_idx;
  for (ref_idx = 0; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];

    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;

    while (fwd_start_idx <= fwd_end_idx &&
           (ref_frame_info[fwd_end_idx].map_idx == lst_map_idx ||
            ref_frame_info[fwd_end_idx].map_idx == gld_map_idx)) {
      fwd_end_idx--;
    }
    if (fwd_start_idx > fwd_end_idx) break;

    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_end_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;

    fwd_end_idx--;
  }

  // Assign all the remaining frame(s), if any, to the earliest reference
  // frame.
  for (; ref_idx < (INTER_REFS_PER_FRAME - 2); ref_idx++) {
    const MV_REFERENCE_FRAME ref_frame = ref_frame_list[ref_idx];
    if (ref_flag_list[ref_frame - LAST_FRAME] == 1) continue;
    set_ref_frame_info(remapped_ref_idx, ref_frame - LAST_FRAME,
                       &ref_frame_info[fwd_start_idx]);
    ref_flag_list[ref_frame - LAST_FRAME] = 1;
  }

  for (int i = 0; i < INTER_REFS_PER_FRAME; i++) {
    assert(ref_flag_list[i] == 1);
  }
}